

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exact.cpp
# Opt level: O1

double __thiscall libDAI::Exact::run(Exact *this)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  undefined4 extraout_var_00;
  ulong uVar3;
  undefined4 extraout_var_01;
  TFactor<double> *Q;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Var *n;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  VarSet *ns;
  undefined4 extraout_var_06;
  long lVar4;
  long lVar5;
  size_t I;
  ulong uVar6;
  double dVar7;
  Factor P;
  undefined1 local_f8 [32];
  pointer local_d8;
  pointer local_d0;
  pointer local_c8;
  TFactor<double> local_c0;
  TFactor<double> local_88;
  VarSet local_50;
  
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Starting ",9);
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(local_f8,this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_f8._0_8_,local_f8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"...",3);
    if ((pointer)local_f8._0_8_ != (pointer)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,(ulong)((long)(long *)local_f8._16_8_ + 1));
    }
  }
  TFactor<double>::TFactor((TFactor<double> *)local_f8);
  uVar6 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x48))
                      ((long *)CONCAT44(extraout_var_00,iVar1));
    if (uVar3 <= uVar6) break;
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    Q = (TFactor<double> *)
        (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x50))
                  ((long *)CONCAT44(extraout_var_01,iVar1),uVar6);
    TFactor<double>::operator*=((TFactor<double> *)local_f8,Q);
    uVar6 = uVar6 + 1;
  }
  if ((long)local_d0 - (long)local_d8 == 0) {
    dVar7 = 0.0;
  }
  else {
    lVar4 = (long)local_d0 - (long)local_d8 >> 3;
    dVar7 = 0.0;
    lVar5 = 0;
    do {
      dVar7 = dVar7 + local_d8[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  dVar7 = log(dVar7);
  *(double *)(this->_logZ)._M_value = dVar7;
  *(undefined8 *)((this->_logZ)._M_value + 8) = 0;
  lVar4 = 0;
  uVar6 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x28))
                      ((long *)CONCAT44(extraout_var_02,iVar1));
    if (uVar3 <= uVar6) break;
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    n = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar1) + 0x30))
                         ((long *)CONCAT44(extraout_var_03,iVar1),uVar6);
    VarSet::VarSet(&local_50,n);
    TFactor<double>::partSum(&local_c0,(TFactor<double> *)local_f8,&local_50);
    TFactor<double>::normalized(&local_88,&local_c0,NORMPROB);
    TFactor<double>::operator=
              ((TFactor<double> *)
               ((long)&(((this->_beliefsV).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4),&local_88);
    if (local_88._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_50._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar6 = uVar6 + 1;
    lVar4 = lVar4 + 0x38;
  }
  lVar4 = 0;
  uVar6 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar1) + 0x48))
                      ((long *)CONCAT44(extraout_var_04,iVar1));
    if (uVar3 <= uVar6) break;
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    ns = (VarSet *)
         (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar1) + 0x50))
                   ((long *)CONCAT44(extraout_var_05,iVar1),uVar6);
    TFactor<double>::partSum(&local_c0,(TFactor<double> *)local_f8,ns);
    TFactor<double>::normalized(&local_88,&local_c0,NORMPROB);
    TFactor<double>::operator=
              ((TFactor<double> *)
               ((long)&(((this->_beliefsF).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4),&local_88);
    if (local_88._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar6 = uVar6 + 1;
    lVar4 = lVar4 + 0x38;
  }
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
  if (CONCAT44(extraout_var_06,iVar1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"finished",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  if (local_d8 != (pointer)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  if ((pointer)local_f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  return 0.0;
}

Assistant:

double Exact::run() {
        if( Verbose() >= 1 )
            cout << "Starting " << identify() << "...";

        Factor P;
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            P *= grm().factor(I);

        double Z = P.totalSum();
        _logZ = std::log(Z);
        for( size_t i = 0; i < grm().nrVars(); i++ )
            _beliefsV[i] = P.partSum(grm().var(i)).normalized();
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            _beliefsF[I] = P.partSum(grm().factor(I).vars()).normalized();

        if( Verbose() >= 1 )
            cout << "finished" << endl;

        return 0.0;
    }